

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void flatbuffers::kotlin::KotlinKMPGenerator::GenerateJvmStaticAnnotation
               (CodeWriter *code,bool gen_jvmstatic)

{
  undefined7 in_register_00000031;
  allocator<char> local_31;
  string local_30;
  
  if ((int)CONCAT71(in_register_00000031,gen_jvmstatic) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"@JvmStatic",&local_31);
    CodeWriter::operator+=(code,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

static void GenerateJvmStaticAnnotation(CodeWriter &code,
                                          bool gen_jvmstatic) {
    if (gen_jvmstatic) { code += "@JvmStatic"; }
  }